

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<char>::setCapacity(Vector<char> *this,size_t newSize)

{
  char *pcVar1;
  ArrayBuilder<char> newBuilder;
  ArrayBuilder<char> local_30;
  
  pcVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pcVar1)) {
    (this->builder).pos = pcVar1 + newSize;
  }
  local_30.ptr = _::HeapArrayDisposer::allocateUninitialized<char>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<char>::addAll<kj::ArrayBuilder<char>>(&local_30,&this->builder);
  ArrayBuilder<char>::operator=(&this->builder,&local_30);
  ArrayBuilder<char>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }